

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<CPU::MOS6502::State::Registers>::declare_emplace<unsigned_char>
          (StructImpl<CPU::MOS6502::State::Registers> *this,uchar *t,string *name,size_t count)

{
  Field local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>
  local_68;
  size_t local_28;
  size_t count_local;
  string *name_local;
  uchar *t_local;
  StructImpl<CPU::MOS6502::State::Registers> *this_local;
  
  local_28 = count;
  count_local = (size_t)name;
  name_local = (string *)t;
  t_local = (uchar *)this;
  Field::Field(&local_88,(type_info *)&unsigned_char::typeinfo,(long)t - (long)this,1,count);
  std::
  make_pair<std::__cxx11::string_const&,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>
            (&local_68,name,&local_88);
  std::
  unordered_map<std::__cxx11::string,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>>>
  ::
  emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>>
            ((unordered_map<std::__cxx11::string,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>>>
              *)&contents__abi_cxx11_,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<CPU::MOS6502::State::Registers>::Field>
  ::~pair(&local_68);
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}